

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeDaddiGroupBranch_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int64_t iVar6;
  uint32_t in_ESI;
  MCInst *in_RDI;
  _Bool HasRs;
  uint32_t Imm;
  uint32_t Rt;
  uint32_t Rs;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  MCRegisterInfo *in_stack_ffffffffffffffc0;
  MCInst *mcInst;
  
  uVar2 = fieldFromInstruction(in_ESI,0x15,5);
  uVar3 = fieldFromInstruction(in_ESI,0x10,5);
  uVar4 = fieldFromInstruction(in_ESI,0,0x10);
  iVar6 = SignExtend64((ulong)uVar4,0x10);
  bVar1 = false;
  if (uVar2 < uVar3) {
    if ((uVar2 == 0) || (uVar3 <= uVar2)) {
      MCInst_setOpcode(in_RDI,0x11e);
    }
    else {
      MCInst_setOpcode(in_RDI,0x113);
      bVar1 = true;
    }
  }
  else {
    MCInst_setOpcode(in_RDI,0x122);
    bVar1 = true;
  }
  if (bVar1) {
    uVar5 = getReg(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    MCOperand_CreateReg0(in_RDI,uVar5);
  }
  mcInst = in_RDI;
  uVar5 = getReg((MCRegisterInfo *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  MCOperand_CreateReg0(mcInst,uVar5);
  MCOperand_CreateImm0(in_RDI,(ulong)(uint)((int)iVar6 << 2));
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeDaddiGroupBranch_4(MCInst *MI, uint32_t insn,
		uint64_t Address, const MCRegisterInfo *Decoder)
{
	// If we are called then we can assume that MIPS32r6/MIPS64r6 is enabled
	// (otherwise we would have matched the ADDI instruction from the earlier
	// ISA's instead).
	//
	// We have:
	//    0b011000 sssss ttttt iiiiiiiiiiiiiiii
	//      BNVC if rs >= rt
	//      BNEZALC if rs == 0 && rt != 0
	//      BNEC if rs < rt && rs != 0

	uint32_t Rs = fieldFromInstruction(insn, 21, 5);
	uint32_t Rt = fieldFromInstruction(insn, 16, 5);
	uint32_t Imm = (uint32_t)SignExtend64(fieldFromInstruction(insn, 0, 16), 16) * 4;
	bool HasRs = false;

	if (Rs >= Rt) {
		MCInst_setOpcode(MI, Mips_BNVC);
		HasRs = true;
	} else if (Rs != 0 && Rs < Rt) {
		MCInst_setOpcode(MI, Mips_BNEC);
		HasRs = true;
	} else
		MCInst_setOpcode(MI, Mips_BNEZALC);

	if (HasRs)
		MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rs));

	MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rt));
	MCOperand_CreateImm0(MI, Imm);

	return MCDisassembler_Success;
}